

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O2

void __thiscall github111116::ConsoleLogger::print<char[8]>(ConsoleLogger *this,char (*t) [8])

{
  std::operator<<(this->out,*t);
  print(this);
  return;
}

Assistant:

void ConsoleLogger::print(const T& t)
{
	out << t;
	print();
}